

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O0

int SharpYuvConvert(void *r_ptr,void *g_ptr,void *b_ptr,int rgb_step,int rgb_stride,
                   int rgb_bit_depth,void *y_ptr,int y_stride,void *u_ptr,int u_stride,void *v_ptr,
                   int v_stride,int yuv_bit_depth,int width,int height,
                   SharpYuvConversionMatrix *yuv_matrix)

{
  int iVar1;
  void *unaff_RBP;
  undefined8 unaff_R14;
  undefined8 unaff_R15;
  void *unaff_retaddr;
  void *in_stack_00000008;
  void *in_stack_00000050;
  int in_stack_00000058;
  SharpYuvOptions options;
  undefined4 in_stack_00000070;
  SharpYuvOptions *in_stack_00000098;
  
  iVar1 = SharpYuvConvertWithOptions
                    (in_stack_00000008,unaff_retaddr,unaff_RBP,(int)((ulong)unaff_R15 >> 0x20),
                     (int)unaff_R15,(int)((ulong)unaff_R14 >> 0x20),in_stack_00000050,
                     in_stack_00000058,options.yuv_matrix,options.transfer_type,
                     (void *)CONCAT44(rgb_bit_depth,in_stack_00000070),rgb_stride,(int)b_ptr,
                     (int)g_ptr,(int)r_ptr,in_stack_00000098);
  return iVar1;
}

Assistant:

int SharpYuvConvert(const void* r_ptr, const void* g_ptr, const void* b_ptr,
                    int rgb_step, int rgb_stride, int rgb_bit_depth,
                    void* y_ptr, int y_stride, void* u_ptr, int u_stride,
                    void* v_ptr, int v_stride, int yuv_bit_depth, int width,
                    int height, const SharpYuvConversionMatrix* yuv_matrix) {
  SharpYuvOptions options;
  options.yuv_matrix = yuv_matrix;
  options.transfer_type = kSharpYuvTransferFunctionSrgb;
  return SharpYuvConvertWithOptions(
      r_ptr, g_ptr, b_ptr, rgb_step, rgb_stride, rgb_bit_depth, y_ptr, y_stride,
      u_ptr, u_stride, v_ptr, v_stride, yuv_bit_depth, width, height, &options);
}